

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkageUntangler.cc
# Opt level: O2

void __thiscall LinkageUntangler::report_selection(LinkageUntangler *this)

{
  long lVar1;
  ostream *poVar2;
  int n;
  ulong __n;
  long lVar3;
  
  lVar3 = 0x40;
  for (__n = 1; lVar1 = *(long *)(**(long **)this + 0x40),
      __n < (ulong)((*(long *)(**(long **)this + 0x48) - lVar1) / 0x38); __n = __n + 1) {
    if (*(char *)(lVar1 + 0x18 + lVar3) != '\x01') {
      std::vector<bool,_std::allocator<bool>_>::operator[]
                ((vector<bool,_std::allocator<bool>_> *)(this + 8),__n);
    }
    lVar3 = lVar3 + 0x38;
  }
  poVar2 = sdglib::OutputLog(INFO,true);
  poVar2 = std::operator<<(poVar2,"Current selection: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," / ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," nodes  with  ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," / ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," bp");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void LinkageUntangler::report_selection() {
    uint64_t total_bp=0,total_count=0,selected_bp=0,selected_count=0;
    for (auto n=1;n<dg.sdg.nodes.size();++n) {
        if (dg.sdg.nodes[n].status == NodeStatus::Deleted) continue;
        total_bp+=dg.sdg.nodes[n].sequence.size();
        ++total_count;
        if (selected_nodes[n]) {
            selected_bp += dg.sdg.nodes[n].sequence.size();
            ++selected_count;
        }
    }
        sdglib::OutputLog()<< "Current selection: "<<selected_count<<" / "<<total_count<<" nodes  with  "<<selected_bp<<" / "<<total_bp<<" bp"<<std::endl;

}